

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twentytwenty.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pbVar4;
  char cVar5;
  size_t sVar6;
  ostream *poVar7;
  istream *piVar8;
  int *piVar9;
  long lVar10;
  int *piVar11;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  int *piVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  _Alloc_hider _Var19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  ulong uVar21;
  ulong uVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  pointer pbVar24;
  _Alloc_hider _Var25;
  int *i_1;
  int *piVar26;
  int *i;
  vector<int,_std::allocator<int>_> input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  ifstream file;
  int *local_2c0;
  int *local_2b8;
  value_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_278;
  char *local_270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  ulong local_248;
  ulong local_240;
  long local_238 [4];
  int aiStack_218 [122];
  
  if (argc == 2) {
    pcVar2 = argv[1];
    sVar6 = strlen(pcVar2);
    std::ifstream::ifstream((istream *)local_238,pcVar2,_S_in);
    if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) == 0) {
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_268.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_298._M_string_length = 0;
      local_298.field_2._M_local_buf[0] = '\0';
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      while( true ) {
        cVar5 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_238,(string *)&local_298,cVar5);
        if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_268,&local_298);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,
                        CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                 local_298.field_2._M_local_buf[0]) + 1);
      }
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_298,
                 (long)local_268.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_268.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_270);
      pbVar4 = local_268.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar24 = local_268.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      _Var19._M_p = local_298._M_dataplus._M_p;
      if (local_268.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_268.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        piVar9 = __errno_location();
        do {
          pcVar2 = (pbVar24->_M_dataplus)._M_p;
          iVar16 = *piVar9;
          *piVar9 = 0;
          lVar10 = strtol(pcVar2,&local_270,10);
          if (local_270 == pcVar2) {
            std::__throw_invalid_argument("stoi");
LAB_00102bf8:
            std::__throw_out_of_range("stoi");
LAB_00102c04:
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          if (((int)lVar10 != lVar10) || (*piVar9 == 0x22)) goto LAB_00102bf8;
          if (*piVar9 == 0) {
            *piVar9 = iVar16;
          }
          *(int *)_Var19._M_p = (int)lVar10;
          pbVar24 = pbVar24 + 1;
          _Var19._M_p = _Var19._M_p + 4;
        } while (pbVar24 != pbVar4);
      }
      std::ranges::__sort_fn::
      operator()<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::ranges::less,_std::identity>
                ((__sort_fn *)&std::ranges::sort,local_298._M_dataplus._M_p,
                 local_298._M_string_length);
      if (local_298._M_dataplus._M_p < local_298._M_string_length) {
        piVar9 = (int *)0x0;
        piVar26 = (int *)0x0;
        local_2b8 = (int *)0x0;
        _Var25._M_p = local_298._M_dataplus._M_p;
        do {
          iVar16 = *(int *)_Var25._M_p;
          iVar17 = iVar16 + -0x7e4;
          if (iVar17 == 0 || iVar16 < 0x7e4) {
            iVar18 = -iVar17;
            uVar22 = (long)(local_298._M_string_length - (long)_Var25._M_p) >> 2;
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var25._M_p;
            while (paVar23 = paVar20, 0 < (long)uVar22) {
              uVar21 = uVar22 >> 1;
              uVar22 = ~uVar21 + uVar22;
              piVar11 = (int *)((long)paVar23 + uVar21 * 4);
              iVar1 = *piVar11;
              paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(piVar11 + 1);
              if (SBORROW4(iVar1,iVar18) == iVar1 + iVar17 < 0) {
                uVar22 = uVar21;
                paVar20 = paVar23;
              }
            }
            if ((paVar23 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_298._M_string_length) && (*(int *)paVar23 <= iVar18)) {
              if (piVar26 == local_2b8) {
                sVar6 = (long)piVar26 - (long)piVar9;
                if (sVar6 == 0x7ffffffffffffff8) {
                  std::__throw_length_error("vector::_M_realloc_insert");
                }
                uVar21 = (long)sVar6 >> 3;
                uVar22 = uVar21;
                if (piVar26 == piVar9) {
                  uVar22 = 1;
                }
                uVar15 = uVar22 + uVar21;
                if (0xffffffffffffffe < uVar15) {
                  uVar15 = 0xfffffffffffffff;
                }
                if (CARRY8(uVar22,uVar21)) {
                  uVar15 = 0xfffffffffffffff;
                }
                if (uVar15 == 0) {
                  piVar11 = (int *)0x0;
                }
                else {
                  piVar11 = (int *)operator_new(uVar15 * 8);
                }
                *(ulong *)(piVar11 + uVar21 * 2) = CONCAT44(iVar18,iVar16);
                if (0 < (long)sVar6) {
                  memmove(piVar11,piVar9,sVar6);
                }
                if (piVar9 != (int *)0x0) {
                  operator_delete(piVar9,(long)local_2b8 - (long)piVar9);
                }
                piVar26 = (int *)((long)piVar11 + sVar6 + 8);
                local_2b8 = piVar11 + uVar15 * 2;
                piVar9 = piVar11;
              }
              else {
                *(ulong *)piVar26 = CONCAT44(iVar18,iVar16);
                piVar26 = piVar26 + 2;
              }
            }
          }
          _Var25._M_p = _Var25._M_p + 4;
          _Var19._M_p = local_298._M_dataplus._M_p;
          piVar11 = piVar9;
        } while (_Var25._M_p < local_298._M_string_length);
      }
      else {
        local_2b8 = (int *)0x0;
        piVar26 = (int *)0x0;
        piVar9 = (int *)0x0;
        _Var19._M_p = local_298._M_dataplus._M_p;
        piVar11 = piVar9;
      }
      for (; local_298._M_dataplus._M_p = _Var19._M_p, piVar9 != piVar26; piVar9 = piVar9 + 2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"i: ",3);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", j: ",5);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,piVar9[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", i*j: ",7);
        plVar12 = (long *)std::ostream::operator<<(poVar7,piVar9[1] * *piVar9);
        std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
        std::ostream::put((char)plVar12);
        std::ostream::flush();
        _Var19._M_p = local_298._M_dataplus._M_p;
      }
      if (_Var19._M_p < local_298._M_string_length) {
        piVar26 = (int *)0x0;
        piVar9 = (int *)0x0;
        local_2c0 = (int *)0x0;
        do {
          uVar22 = (long)(local_298._M_string_length - (long)_Var19._M_p) >> 2;
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var19._M_p;
          local_278 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var19._M_p;
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var19._M_p;
          if (0 < (long)uVar22) {
            do {
              uVar21 = uVar22 >> 1;
              uVar22 = ~uVar21 + uVar22;
              paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)paVar20 + (uVar21 + 1) * 4);
              if (0x7e4 - *(int *)_Var19._M_p < *(int *)((long)paVar13 + -4)) {
                uVar22 = uVar21;
                paVar13 = paVar20;
              }
              paVar20 = paVar13;
            } while (0 < (long)uVar22);
          }
          for (; _Var19._M_p < paVar20; _Var19._M_p = _Var19._M_p + 4) {
            iVar16 = *(int *)paVar23;
            iVar17 = *(int *)_Var19._M_p;
            iVar18 = 0x7e4 - (iVar16 + iVar17);
            if (-1 < iVar18) {
              uVar22 = (long)paVar20 - (long)_Var19._M_p >> 2;
              paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var19._M_p;
              while (paVar3 = paVar13, 0 < (long)uVar22) {
                uVar21 = uVar22 >> 1;
                uVar22 = ~uVar21 + uVar22;
                piVar14 = (int *)((long)paVar3 + uVar21 * 4);
                paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(piVar14 + 1);
                if (iVar18 <= *piVar14) {
                  uVar22 = uVar21;
                  paVar13 = paVar3;
                }
              }
              if ((paVar3 != paVar20) && (*(int *)paVar3 <= iVar18)) {
                if (piVar9 == local_2c0) {
                  sVar6 = (long)piVar9 - (long)piVar26;
                  if (sVar6 == 0x7ffffffffffffff8) goto LAB_00102c04;
                  uVar21 = ((long)sVar6 >> 2) * -0x5555555555555555;
                  uVar22 = uVar21;
                  if (piVar9 == piVar26) {
                    uVar22 = 1;
                  }
                  local_240 = uVar22 + uVar21;
                  if (0xaaaaaaaaaaaaaa9 < local_240) {
                    local_240 = 0xaaaaaaaaaaaaaaa;
                  }
                  if (CARRY8(uVar22,uVar21)) {
                    local_240 = 0xaaaaaaaaaaaaaaa;
                  }
                  if (local_240 == 0) {
                    piVar14 = (int *)0x0;
                  }
                  else {
                    local_248 = uVar21;
                    piVar14 = (int *)operator_new(local_240 * 0xc);
                    paVar23 = local_278;
                    uVar21 = local_248;
                  }
                  piVar14[uVar21 * 3] = iVar16;
                  piVar14[uVar21 * 3 + 1] = iVar17;
                  piVar14[uVar21 * 3 + 2] = iVar18;
                  if (0 < (long)sVar6) {
                    memmove(piVar14,piVar26,sVar6);
                    paVar23 = local_278;
                  }
                  if (piVar26 != (int *)0x0) {
                    operator_delete(piVar26,(long)local_2c0 - (long)piVar26);
                    paVar23 = local_278;
                  }
                  piVar9 = (int *)((long)piVar14 + sVar6 + 0xc);
                  local_2c0 = piVar14 + local_240 * 3;
                  piVar26 = piVar14;
                }
                else {
                  *piVar9 = iVar16;
                  piVar9[1] = iVar17;
                  piVar9[2] = iVar18;
                  piVar9 = piVar9 + 3;
                }
              }
            }
          }
          _Var19._M_p = (pointer)((long)paVar23 + 4);
          piVar14 = piVar26;
        } while (_Var19._M_p < local_298._M_string_length);
      }
      else {
        local_2c0 = (int *)0x0;
        piVar9 = (int *)0x0;
        piVar26 = (int *)0x0;
        piVar14 = piVar26;
      }
      for (; piVar26 != piVar9; piVar26 = piVar26 + 3) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"i: ",3);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar26);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"j: ",3);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,piVar26[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"k: ",3);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,piVar26[2]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"i*j*k: ",7);
        plVar12 = (long *)std::ostream::operator<<(poVar7,piVar26[1] * *piVar26 * piVar26[2]);
        std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
        std::ostream::put((char)plVar12);
        std::ostream::flush();
      }
      if (piVar14 != (int *)0x0) {
        operator_delete(piVar14,(long)local_2c0 - (long)piVar14);
      }
      if (piVar11 != (int *)0x0) {
        operator_delete(piVar11,(long)local_2b8 - (long)piVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_298._M_dataplus._M_p,
                        CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                 local_298.field_2._M_local_buf[0]) -
                        (long)local_298._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_268);
      iVar16 = 0;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Could not open ",0xf);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,pcVar2,sVar6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      iVar16 = 1;
      std::ostream::flush();
    }
    std::ifstream::~ifstream(local_238);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
    pcVar2 = *argv;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070a0);
    }
    else {
      sVar6 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," path-to-input",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
    iVar16 = 0;
  }
  return iVar16;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  namespace ranges = std::ranges;

  constexpr auto twenty20 = 2020;

  if (argc != 2) {
    std::cout << "usage: " << argv[0] << " path-to-input" << std::endl;
    return 0;
  }

  std::string_view path = argv[1];

  auto file = std::ifstream{path.begin()};

  if (!file.good()) {
    std::cout << "Could not open " << path << std::endl;
    return 1;
  }

  std::vector<std::string> tokens;
  for (std::string line; std::getline(file, line);)
    tokens.push_back(line);

  std::vector<int> input (tokens.size());
  std::ranges::transform(tokens, input.begin(), [](const auto& line){
    return std::stoi(line);
  });

  ranges::sort(input);

  struct ij { int i, j; };
  std::vector<ij> matching_pairs;
  // for all items `i`
  for (auto i = input.cbegin(); i < input.cend(); i++) {
    // determine whether `2020-i` is in the input
    auto j = twenty20 - *i;
    if (j >= 0 && std::binary_search(i, input.cend(), j) )
      matching_pairs.emplace_back(ij{*i,j});
  }

  ranges::for_each(matching_pairs, [](const auto& ij){
    auto& [i, j] = ij;
    std::cout << "i: " << i << ", j: " << j << ", i*j: " << i*j << std::endl;
  });

  struct ijk { int i, j, k; };
  std::vector<ijk> matching_triples;
  // for all items `i`
  for (auto i = input.cbegin(); i < input.cend(); i++) {
    // find the upper bound `ub` s.t. `i+j <= 2020`
    // and for all items `j` in the range `[i,ub]`
    auto ub = std::upper_bound(i, input.cend(), twenty20 - *i);
    for (auto j = i; j < ub; j++) {
      // determine whether 2020-i-j is in the list
      auto k = twenty20 - *i - *j;
      if (k >= 0 && std::binary_search(j, ub, k))
        matching_triples.emplace_back(ijk{*i, *j, k});
    }
  }

  ranges::for_each(matching_triples, [](const auto& ijk){
    auto& [i,j,k] = ijk;
    std::cout <<
              "i: " << i << ", " <<
              "j: " << j << ", " <<
              "k: " << k << ", " <<
              "i*j*k: " << i*j*k << std::endl;
  });

}